

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O0

void __thiscall
spvtools::opt::FixStorageClass::FixInstructionStorageClass
          (FixStorageClass *this,Instruction *inst,StorageClass storage_class,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *seen)

{
  bool bVar1;
  DefUseManager *this_00;
  reference ppIVar2;
  Instruction *use;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  function<void_(spvtools::opt::Instruction_*)> local_60;
  undefined1 local_40 [8];
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> uses;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *seen_local;
  StorageClass storage_class_local;
  Instruction *inst_local;
  FixStorageClass *this_local;
  
  uses.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)seen;
  bVar1 = IsPointerResultType(this,inst);
  if (!bVar1) {
    __assert_fail("IsPointerResultType(inst) && \"The result type of the instruction must be a pointer.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                  ,0x77,
                  "void spvtools::opt::FixStorageClass::FixInstructionStorageClass(Instruction *, spv::StorageClass, std::set<uint32_t> *)"
                 );
  }
  ChangeResultStorageClass(this,inst,storage_class);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_40);
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  __range2 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_40;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::FixStorageClass::FixInstructionStorageClass(spvtools::opt::Instruction*,spv::StorageClass,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>*)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_60,
             (anon_class_8_1_899298ca *)&__range2);
  analysis::DefUseManager::ForEachUser(this_00,inst,&local_60);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_60);
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)local_40);
  use = (Instruction *)
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            local_40);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                     *)&use), bVar1) {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    PropagateStorageClass
              (this,*ppIVar2,storage_class,
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               uses.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_40);
  return;
}

Assistant:

void FixStorageClass::FixInstructionStorageClass(
    Instruction* inst, spv::StorageClass storage_class,
    std::set<uint32_t>* seen) {
  assert(IsPointerResultType(inst) &&
         "The result type of the instruction must be a pointer.");

  ChangeResultStorageClass(inst, storage_class);

  std::vector<Instruction*> uses;
  get_def_use_mgr()->ForEachUser(
      inst, [&uses](Instruction* use) { uses.push_back(use); });
  for (Instruction* use : uses) {
    PropagateStorageClass(use, storage_class, seen);
  }
}